

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_context.c
# Opt level: O3

GLFWglproc getProcAddressGLX(char *procname)

{
  __GLXextproc p_Var1;
  GLFWglproc p_Var2;
  PFNGLXGETPROCADDRESSPROC UNRECOVERED_JUMPTABLE;
  
  UNRECOVERED_JUMPTABLE = _glfw.glx.GetProcAddress;
  if ((_glfw.glx.GetProcAddress == (PFNGLXGETPROCADDRESSPROC)0x0) &&
     (UNRECOVERED_JUMPTABLE = _glfw.glx.GetProcAddressARB,
     _glfw.glx.GetProcAddressARB == (PFNGLXGETPROCADDRESSPROC)0x0)) {
    p_Var2 = (GLFWglproc)dlsym(_glfw.glx.handle);
    return p_Var2;
  }
  p_Var1 = (*UNRECOVERED_JUMPTABLE)((GLubyte *)procname);
  return p_Var1;
}

Assistant:

static GLFWglproc getProcAddressGLX(const char* procname)
{
    if (_glfw.glx.GetProcAddress)
        return _glfw.glx.GetProcAddress((const GLubyte*) procname);
    else if (_glfw.glx.GetProcAddressARB)
        return _glfw.glx.GetProcAddressARB((const GLubyte*) procname);
    else
        return dlsym(_glfw.glx.handle, procname);
}